

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredQLastTimeStepOrQPOMDP.cpp
# Opt level: O2

void __thiscall
FactoredQLastTimeStepOrQPOMDP::FactoredQLastTimeStepOrQPOMDP
          (FactoredQLastTimeStepOrQPOMDP *this,PlanningUnitFactoredDecPOMDPDiscrete *puf)

{
  QPOMDP *this_00;
  
  (this->super_FactoredQLastTimeStepOrElse).super_FactoredQFunctionStateJAOHInterface.
  super_QFunctionJAOHInterface =
       (QFunctionJAOHInterface)&PTR__QFunctionForDecPOMDPInterface_005dac60;
  QFunctionForFactoredDecPOMDPInterface::QFunctionForFactoredDecPOMDPInterface
            ((QFunctionForFactoredDecPOMDPInterface *)
             &(this->super_FactoredQLastTimeStepOrElse).super_QFunctionForFactoredDecPOMDP,
             &PTR_construction_vtable_152__005da568);
  FactoredQLastTimeStepOrElse::FactoredQLastTimeStepOrElse
            (&this->super_FactoredQLastTimeStepOrElse,&PTR_construction_vtable_136__005da4c0,puf);
  (this->super_FactoredQLastTimeStepOrElse).super_FactoredQFunctionStateJAOHInterface.
  super_QFunctionJAOHInterface = (QFunctionJAOHInterface)0x5da2f0;
  *(undefined8 *)&(this->super_FactoredQLastTimeStepOrElse).super_QFunctionForFactoredDecPOMDP =
       0x5da438;
  this_00 = (QPOMDP *)operator_new(0x60);
  QPOMDP::QPOMDP(this_00,&puf->super_PlanningUnitDecPOMDPDiscrete);
  this->_m_QPOMDP = this_00;
  return;
}

Assistant:

FactoredQLastTimeStepOrQPOMDP::
FactoredQLastTimeStepOrQPOMDP(const PlanningUnitFactoredDecPOMDPDiscrete* puf) :
    FactoredQLastTimeStepOrElse(puf)
{
    _m_QPOMDP=new QPOMDP(puf);
}